

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool is_name_only(char *path)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *in_RDI;
  char *p;
  char temp [260];
  char ext [260];
  char fname [260];
  char current_dir [260];
  char drive [260];
  char *in_stack_fffffffffffffa98;
  char *in_stack_fffffffffffffaa0;
  char *in_stack_fffffffffffffaa8;
  char *in_stack_fffffffffffffab0;
  char local_448 [272];
  char local_338 [272];
  char local_228 [551];
  _Bool local_1;
  
  sVar2 = strlen(in_RDI);
  if (sVar2 == 0) {
    local_1 = false;
  }
  else {
    split_path(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
               in_stack_fffffffffffffa98,(char *)0x19535c);
    sVar2 = strlen(local_228);
    if (sVar2 == 0) {
      sVar2 = strlen(local_338);
      if (sVar2 == 0) {
        local_1 = false;
      }
      else {
        sVar2 = strlen(local_448);
        if (sVar2 != 0) {
          strcpy(&stack0xfffffffffffffaa8,local_448);
          for (pcVar3 = &stack0xfffffffffffffaa8; *pcVar3 != '\0'; pcVar3 = pcVar3 + 1) {
            iVar1 = tolower((int)*pcVar3);
            *pcVar3 = (char)iVar1;
          }
          iVar1 = strcmp(&stack0xfffffffffffffaa8,G_VOICE_EXT);
          if (iVar1 == 0) {
            return false;
          }
        }
        local_1 = true;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool is_name_only(const char *path)
{
	if (strlen(path) == 0)
	{
		return false;
	}
	char drive[MAX_PATH];
	char current_dir[MAX_PATH];
	char fname[MAX_PATH];
	char ext[MAX_PATH];
	split_path(path, drive, current_dir, fname, ext);
#if defined(_WIN32)
	if (strlen(drive) != 0)
	{
		return false;
	}
#endif
	if (strlen(current_dir) != 0)
	{
		return false;
	}
	if (strlen(fname) == 0)
	{
		return false;
	}
	if (strlen(ext) != 0)
	{
		char temp[MAX_PATH];
		strcpy(temp, ext);
		char *p;
		for (p = temp; *p; p++)
		{
			*p = tolower(*p);
		}
		if (strcmp(temp, G_VOICE_EXT) == 0)
		{
			return false;
		}
	}
	return true;
}